

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

void __thiscall minja::LiteralExpr::LiteralExpr(LiteralExpr *this,Location *loc,Value *v)

{
  Value *in_RDI;
  Value *unaff_retaddr;
  Location *in_stack_ffffffffffffffc8;
  Value *pVVar1;
  
  pVVar1 = in_RDI;
  Expression::Expression((Expression *)in_RDI,in_stack_ffffffffffffffc8);
  (in_RDI->super_enable_shared_from_this<minja::Value>)._M_weak_this.
  super___weak_ptr<minja::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&PTR_do_evaluate_0041aa08;
  Value::Value(unaff_retaddr,pVVar1);
  return;
}

Assistant:

LiteralExpr(const Location & loc, const Value& v)
      : Expression(loc), value(v) {}